

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O1

void __thiscall State::AddPool(State *this,Pool *pool)

{
  iterator iVar1;
  mapped_type *ppPVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
          ::find(&(this->pools_)._M_t,&pool->name_);
  if (((_Rb_tree_header *)iVar1._M_node != &(this->pools_)._M_t._M_impl.super__Rb_tree_header) &&
     (*(long *)(iVar1._M_node + 2) != 0)) {
    __assert_fail("LookupPool(pool->name()) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/state.cc"
                  ,0x54,"void State::AddPool(Pool *)");
  }
  ppPVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
            ::operator[](&this->pools_,&pool->name_);
  *ppPVar2 = pool;
  return;
}

Assistant:

void State::AddPool(Pool* pool) {
  assert(LookupPool(pool->name()) == NULL);
  pools_[pool->name()] = pool;
}